

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xrep.c
# Opt level: O0

int nn_xrep_recv(nn_sockbase *self,nn_msg *msg)

{
  uint32_t uVar1;
  char *pcVar2;
  size_t sVar3;
  void *pvVar4;
  nn_chunkref *pnVar5;
  uint8_t *buf;
  nn_chunkref *src;
  nn_chunkref *in_RSI;
  nn_fq *in_RDI;
  nn_xrep_data *pipedata;
  nn_chunkref ref;
  size_t sz;
  void *data;
  int maxttl;
  int i;
  nn_pipe *pipe;
  nn_xrep *xrep;
  int rc;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  nn_chunkref *in_stack_ffffffffffffff70;
  nn_pipe **in_stack_ffffffffffffff78;
  nn_msg *in_stack_ffffffffffffff80;
  FILE *__stream;
  nn_chunkref *in_stack_ffffffffffffff90;
  nn_chunkref local_68;
  ulong local_48;
  void *local_40;
  int local_38;
  int local_34;
  nn_pipe *local_30;
  nn_fq *local_28;
  uint local_1c;
  nn_chunkref *local_18;
  uint local_4;
  
  if (in_RDI == (nn_fq *)0x0) {
    in_RDI = (nn_fq *)0x0;
  }
  local_28 = in_RDI;
  local_18 = in_RSI;
  local_1c = nn_fq_recv(in_RDI,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  local_4 = local_1c;
  if (-1 < (int)local_1c) {
    if ((local_1c & 2) == 0) {
      local_48 = 4;
      local_1c = nn_sockbase_getopt((nn_sockbase *)in_stack_ffffffffffffff80,
                                    (int)((ulong)in_stack_ffffffffffffff78 >> 0x20),
                                    in_stack_ffffffffffffff70,
                                    (size_t *)
                                    CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      if (local_1c != 0) {
        nn_backtrace_print();
        __stream = _stderr;
        pcVar2 = nn_err_strerror(in_stack_ffffffffffffff6c);
        fprintf(__stream,"%s [%d] (%s:%d)\n",pcVar2,(ulong)-local_1c,
                "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/protocols/reqrep/xrep.c"
                ,0xd5);
        fflush(_stderr);
        nn_err_abort();
      }
      local_40 = nn_chunkref_data(local_18 + 2);
      local_48 = nn_chunkref_size(in_stack_ffffffffffffff70);
      for (local_34 = 0; (ulong)((long)(local_34 + 1) * 4) <= local_48; local_34 = local_34 + 1) {
        uVar1 = nn_getl((uint8_t *)((long)local_40 + (long)local_34 * 4));
        if ((uVar1 & 0x80000000) != 0) {
          local_34 = local_34 + 1;
          if (local_38 < local_34) {
            nn_msg_term((nn_msg *)0x12fd7a);
            return -0xb;
          }
          sVar3 = nn_chunkref_size(in_stack_ffffffffffffff70);
          if (sVar3 != 0) {
            nn_backtrace_print();
            fprintf(_stderr,"Assertion failed: %s (%s:%d)\n","nn_chunkref_size (&msg->sphdr) == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/nqbit[P]goestools/vendor/nanomsg/src/protocols/reqrep/xrep.c"
                    ,0xf2);
            fflush(_stderr);
            nn_err_abort();
          }
          nn_chunkref_term(in_stack_ffffffffffffff70);
          nn_chunkref_init(in_stack_ffffffffffffff90,(size_t)in_RDI);
          pvVar4 = nn_chunkref_data(local_18);
          memcpy(pvVar4,local_40,(long)local_34 << 2);
          nn_chunkref_trim(in_stack_ffffffffffffff70,
                           CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
          goto LAB_0012fe56;
        }
      }
      nn_msg_term((nn_msg *)0x12fd19);
      local_4 = 0xfffffff5;
    }
    else {
LAB_0012fe56:
      pnVar5 = (nn_chunkref *)nn_pipe_getdata(local_30);
      nn_chunkref_size(in_stack_ffffffffffffff70);
      nn_chunkref_init(pnVar5,(size_t)in_RDI);
      buf = (uint8_t *)nn_chunkref_data(&local_68);
      nn_putl(buf,*(uint32_t *)((long)&pnVar5->u + 8));
      pvVar4 = nn_chunkref_data(&local_68);
      pnVar5 = (nn_chunkref *)((long)pvVar4 + 4);
      src = (nn_chunkref *)nn_chunkref_data(local_18);
      sVar3 = nn_chunkref_size(pnVar5);
      memcpy(pnVar5,src,sVar3);
      nn_chunkref_term(pnVar5);
      nn_chunkref_mv(&in_stack_ffffffffffffff80->sphdr,src);
      local_4 = 0;
    }
  }
  return local_4;
}

Assistant:

int nn_xrep_recv (struct nn_sockbase *self, struct nn_msg *msg)
{
    int rc;
    struct nn_xrep *xrep;
    struct nn_pipe *pipe;
    int i;
    int maxttl;
    void *data;
    size_t sz;
    struct nn_chunkref ref;
    struct nn_xrep_data *pipedata;

    xrep = nn_cont (self, struct nn_xrep, sockbase);

    rc = nn_fq_recv (&xrep->inpipes, msg, &pipe);
    if (nn_slow (rc < 0))
        return rc;

    if (!(rc & NN_PIPE_PARSED)) {

        sz = sizeof (maxttl);
        rc = nn_sockbase_getopt (self, NN_MAXTTL, &maxttl, &sz);
        errnum_assert (rc == 0, -rc);

        /*  Determine the size of the message header. */
        data = nn_chunkref_data (&msg->body);
        sz = nn_chunkref_size (&msg->body);
        i = 0;
        while (1) {

            /*  Ignore the malformed requests without the bottom of the stack. */
            if (nn_slow ((i + 1) * sizeof (uint32_t) > sz)) {
                nn_msg_term (msg);
                return -EAGAIN;
            }

            /*  If the bottom of the backtrace stack is reached, proceed. */
            if (nn_getl ((uint8_t*)(((uint32_t*) data) + i)) & 0x80000000)
                break;

            ++i;
        }
        ++i;

        /* If we encountered too many hops, just toss the message */
        if (i > maxttl) {
            nn_msg_term (msg);
            return -EAGAIN;
        }

        /*  Split the header and the body. */
        nn_assert (nn_chunkref_size (&msg->sphdr) == 0);
        nn_chunkref_term (&msg->sphdr);
        nn_chunkref_init (&msg->sphdr, i * sizeof (uint32_t));
        memcpy (nn_chunkref_data (&msg->sphdr), data, i * sizeof (uint32_t));
        nn_chunkref_trim (&msg->body, i * sizeof (uint32_t));
    }

    /*  Prepend the header by the pipe key. */
    pipedata = nn_pipe_getdata (pipe);
    nn_chunkref_init (&ref,
        nn_chunkref_size (&msg->sphdr) + sizeof (uint32_t));
    nn_putl (nn_chunkref_data (&ref), pipedata->outitem.key);
    memcpy (((uint8_t*) nn_chunkref_data (&ref)) + sizeof (uint32_t),
        nn_chunkref_data (&msg->sphdr), nn_chunkref_size (&msg->sphdr));
    nn_chunkref_term (&msg->sphdr);
    nn_chunkref_mv (&msg->sphdr, &ref);

    return 0;
}